

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreSimplify.cpp
# Opt level: O3

void mathCore::equiv_standarizer(expression *a)

{
  _Rb_tree_header *p_Var1;
  expression *a_00;
  bool bVar2;
  const_iterator cVar3;
  iterator iVar4;
  const_iterator __position;
  _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
  *p_Var5;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar6;
  expression *first;
  _Alloc_node __an;
  expSet tempStore;
  expression *peVar7;
  expression *peVar8;
  expression *local_80;
  _Alloc_node local_78;
  _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
  *local_70;
  expression *local_68;
  _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
  local_60;
  
  bVar2 = is_equiv(a);
  if (bVar2) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var5 = (_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
              *)&a->contents;
    p_Var1 = &(a->contents)._M_t._M_impl.super__Rb_tree_header;
    local_70 = p_Var5;
    local_68 = a;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    while (peVar7 = local_68,
          2 < (local_68->contents)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      std::
      _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
      ::clear(&local_60);
      cVar3._M_node = (peVar7->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 = local_70;
      __position._M_node = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      while (local_70 = p_Var5, (_Rb_tree_header *)cVar3._M_node != p_Var1) {
        peVar7 = *(expression **)(cVar3._M_node + 1);
        cVar3._M_node =
             (_Base_ptr)
             std::
             _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
             ::erase_abi_cxx11_(p_Var5,cVar3);
        if ((_Rb_tree_header *)cVar3._M_node == p_Var1) {
          local_78._M_t = &local_60;
          std::
          _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
          ::
          _M_insert_equal_<expression*const&,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
                    ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                      *)local_78._M_t,__position,(expression **)&stack0xffffffffffffff78,&local_78);
          p_Var5 = local_70;
        }
        else {
          peVar8 = *(expression **)(cVar3._M_node + 1);
          iVar4 = std::
                  _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                  ::erase_abi_cxx11_(local_70,cVar3);
          copy((EVP_PKEY_CTX *)peVar7,(EVP_PKEY_CTX *)cVar3._M_node);
          copy((EVP_PKEY_CTX *)peVar8,(EVP_PKEY_CTX *)cVar3._M_node);
          negate(peVar7);
          negate(peVar8);
          binary_and(peVar7,(expression *)0x1083e5);
          binary_and(peVar7,(expression *)0x1083f3);
          local_80 = binary_or(peVar7,(expression *)0x1083fe);
          local_78._M_t = &local_60;
          __position._M_node =
               (_Base_ptr)
               std::
               _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
               ::
               _M_insert_equal_<expression*,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
                         ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                           *)local_78._M_t,__position,&local_80,&local_78);
          cVar3._M_node = iVar4._M_node;
          p_Var5 = local_70;
        }
      }
      mergeMultiSet((expSet *)p_Var5,(expSet *)&local_60);
    }
    cVar3._M_node = (local_68->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    peVar8 = *(expression **)(cVar3._M_node + 1);
    iVar4 = std::
            _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
            ::erase_abi_cxx11_(p_Var5,cVar3);
    a_00 = *(expression **)(iVar4._M_node + 1);
    std::
    _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
    ::erase_abi_cxx11_(p_Var5,(const_iterator)iVar4._M_node);
    copy((EVP_PKEY_CTX *)peVar8,(EVP_PKEY_CTX *)iVar4._M_node);
    copy((EVP_PKEY_CTX *)a_00,(EVP_PKEY_CTX *)iVar4._M_node);
    negate(peVar8);
    negate(a_00);
    local_80 = binary_and(peVar8,(expression *)0x1084bd);
    p_Var5 = local_70;
    pVar6 = std::
            _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
            ::_M_get_insert_equal_pos
                      ((_Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
                        *)local_70,&local_80);
    local_78._M_t =
         (_Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
          *)p_Var5;
    std::
    _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
    ::
    _M_insert_<expression*,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
              (p_Var5,pVar6.first,pVar6.second,&local_80,&local_78);
    local_80 = binary_and(peVar8,(expression *)0x1084f5);
    pVar6 = std::
            _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
            ::_M_get_insert_equal_pos
                      ((_Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
                        *)p_Var5,&local_80);
    local_78._M_t =
         (_Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
          *)p_Var5;
    std::
    _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
    ::
    _M_insert_<expression*,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
              (p_Var5,pVar6.first,pVar6.second,&local_80,&local_78);
    trans_or(peVar7);
    std::
    _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void mathCore::equiv_standarizer(expression* a) {
	if (mathCore::is_equiv(a)) {
		// Just by the number of variables you can grasp how much more complicated this is!
		expSet tempStore;
		expSet::iterator iter, hintOther;
		expression *first, *second, *firstNew, *secondNew;

		// Keep going until there are at most two things in the tree!
		while (a->contents.size() > 2) {
			// Clear the tempStore, Start at the beginning!
			tempStore.clear();
			iter = a->contents.begin();
			hintOther = tempStore.begin();	// Hints to make this crazy slow thing faster!

											// This runs until we are at the end of the expression!
			while (iter != a->contents.end()) {

				first = *iter;
				iter = a->contents.erase(iter); // Remove it from contents, go forward!
				if (iter == a->contents.end()) { // If we have no other pair just insert first into the tempStore and continue!
					tempStore.insert(hintOther, first);
				}
				else {
					second = *iter;		// Pair of first!
					iter = a->contents.erase(iter);	// Keep moving forward!

													// Construct ~a*~b + a*b !
					firstNew = mathCore::copy(first);
					secondNew = mathCore::copy(second);
					mathCore::negate(first);
					mathCore::negate(second);

					// Hints keep this faster!
					hintOther = tempStore.insert(hintOther,
						// AND OR of AND's!
						mathCore::binary_or(binary_and(first, second), binary_and(firstNew, secondNew)));
				}

			}
			// Now Merge tempStore into a, and continue all over again!
			mergeMultiSet(a->contents, tempStore);
		}

		// Now the EQUIV has exactly 2 elements!
		iter = a->contents.begin();
		first = *iter;
		iter = a->contents.erase(iter);
		second = *iter;
		iter = a->contents.erase(iter);
		// Remove them and construct the new things which go into the EQUIV!

		firstNew = mathCore::copy(first);
		secondNew = mathCore::copy(second);
		mathCore::negate(first);
		mathCore::negate(second);

		// Finally insert these last two into the EQUIV!
		a->contents.insert(binary_and(first, second));
		a->contents.insert(binary_and(firstNew, secondNew));

		// Now we are an OR expression!
		mathCore::trans_or(a);
	}
}